

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimized.cpp
# Opt level: O3

void anon_unknown.dwarf_2761c7::readValidateFile
               (char *pFilename,int pHeight,int pWidth,EImageType pImageType,bool pIsStereo)

{
  int iVar1;
  int iVar2;
  Slice *pSVar3;
  bool bVar4;
  char cVar5;
  int pNbChannels;
  int iVar6;
  half *phVar7;
  char *pcVar8;
  int *piVar9;
  half *phVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  char *pcVar16;
  InputFile lFile_1;
  InputFile lFile;
  Array2D<Imath_3_2::half> lPixels;
  FrameBuffer lInputFrameBuffer;
  Slice local_68 [56];
  
  if (pImageType == IMAGE_TYPE_RGB) {
    pNbChannels = 3;
  }
  else {
    if (pImageType == IMAGE_TYPE_OTHER) {
      pNbChannels = 2;
      bVar4 = true;
      goto LAB_001933f1;
    }
    pNbChannels = 4;
  }
  bVar4 = false;
LAB_001933f1:
  lPixels._sizeX = 0;
  lPixels._sizeY = 0;
  lPixels._data = (half *)0x0;
  lVar15 = (long)pHeight;
  lVar12 = (long)(pNbChannels * pWidth);
  uVar11 = 0xffffffffffffffff;
  if (-1 < lVar12 * lVar15) {
    uVar11 = lVar12 * lVar15 * 2;
  }
  phVar7 = (half *)operator_new__(uVar11);
  lPixels._sizeX = lVar15;
  lPixels._sizeY = lVar12;
  lPixels._data = phVar7;
  if (pIsStereo) {
    pcVar8 = (char *)operator_new__(uVar11);
    _lFile_1 = lVar15;
    iVar6 = Imf_3_2::globalThreadCount();
    Imf_3_2::InputFile::InputFile(&lFile,pFilename,iVar6);
    Imf_3_2::InputFile::header();
    piVar9 = (int *)Imf_3_2::Header::dataWindow();
    iVar6 = piVar9[1];
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    uVar11 = (ulong)(uint)(pNbChannels * 2);
    uVar13 = (long)((piVar9[2] - *piVar9) + 1) * uVar11;
    uVar14 = 0;
    phVar10 = phVar7;
    pcVar16 = pcVar8;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      pSVar3 = *(Slice **)((long)&(anonymous_namespace)::CHANNEL_NAMES + uVar14);
      Imf_3_2::Slice::Slice
                (local_68,HALF,(char *)phVar10,uVar11,uVar13,1,1,
                 (double)*(float *)(_imath_half_to_float_table +
                                   (ulong)(anonymous_namespace)::ALPHA_DEFAULT_VALUE * 4),false,
                 false);
      Imf_3_2::FrameBuffer::insert((char *)&lInputFrameBuffer,pSVar3);
      pSVar3 = *(Slice **)((long)&(anonymous_namespace)::CHANNEL_NAMES_LEFT + uVar14);
      Imf_3_2::Slice::Slice
                (local_68,HALF,pcVar16,uVar11,uVar13,1,1,
                 (double)*(float *)(_imath_half_to_float_table +
                                   (ulong)(anonymous_namespace)::ALPHA_DEFAULT_VALUE * 4),false,
                 false);
      Imf_3_2::FrameBuffer::insert((char *)&lInputFrameBuffer,pSVar3);
      uVar14 = uVar14 + 8;
      pcVar16 = pcVar16 + 2;
      phVar10 = phVar10 + 1;
    } while ((uint)(pNbChannels * 8) != uVar14);
    Imf_3_2::InputFile::setFrameBuffer((FrameBuffer *)&lFile);
    Imf_3_2::InputFile::readPixels((int)&lFile,iVar6);
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&lInputFrameBuffer);
    Imf_3_2::InputFile::~InputFile(&lFile);
    validatePixels((int *)(ulong)(uint)pHeight,(int *)(ulong)(uint)pWidth,&lPixels,pNbChannels,false
                  );
    validatePixels((int *)(ulong)(uint)pHeight,(int *)(ulong)(uint)pWidth,
                   (Array2D<Imath_3_2::half> *)&lFile_1,pNbChannels,true);
    operator_delete__(pcVar8);
  }
  else {
    iVar6 = Imf_3_2::globalThreadCount();
    Imf_3_2::InputFile::InputFile(&lFile_1,pFilename,iVar6);
    Imf_3_2::InputFile::header();
    piVar9 = (int *)Imf_3_2::Header::dataWindow();
    iVar6 = piVar9[1];
    iVar1 = piVar9[2];
    iVar2 = *piVar9;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    uVar11 = 0;
    phVar10 = phVar7;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      pSVar3 = *(Slice **)((long)&(anonymous_namespace)::CHANNEL_NAMES + uVar11);
      Imf_3_2::Slice::Slice
                (local_68,HALF,(char *)phVar10,(ulong)(uint)(pNbChannels * 2),
                 (long)((iVar1 - iVar2) + 1) * (ulong)(uint)(pNbChannels * 2),1,1,
                 (double)*(float *)(_imath_half_to_float_table +
                                   (ulong)(anonymous_namespace)::ALPHA_DEFAULT_VALUE * 4),false,
                 false);
      Imf_3_2::FrameBuffer::insert((char *)&lInputFrameBuffer,pSVar3);
      uVar11 = uVar11 + 8;
      phVar10 = phVar10 + 1;
    } while ((uint)(pNbChannels * 8) != uVar11);
    Imf_3_2::InputFile::setFrameBuffer((FrameBuffer *)&lFile_1);
    cVar5 = Imf_3_2::InputFile::isOptimizationEnabled();
    if (cVar5 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," optimization disabled\n",0x17);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," optimization enabled\n",0x16);
      if (bVar4) {
        std::operator<<((ostream *)&std::cerr,
                        " error: isOptimizationEnabled returned TRUE, but optimization not known to work for two channel images\n"
                       );
        __assert_fail("pNbChannels != 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testOptimized.cpp"
                      ,0x14a,
                      "void (anonymous namespace)::readPixels(const char *, int, Array2D<half> &)");
      }
    }
    Imf_3_2::InputFile::readPixels((int)&lFile_1,iVar6);
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&lInputFrameBuffer);
    Imf_3_2::InputFile::~InputFile(&lFile_1);
    validatePixels((int *)(ulong)(uint)pHeight,(int *)(ulong)(uint)pWidth,&lPixels,pNbChannels,false
                  );
  }
  operator_delete__(phVar7);
  return;
}

Assistant:

void
readValidateFile (
    const char pFilename[],
    int        pHeight,
    int        pWidth,
    EImageType pImageType,
    bool       pIsStereo)
{
    const int lNbChannels = getNbChannels (pImageType);

    Array2D<half> lPixels;
    lPixels.resizeErase (pHeight, pWidth * lNbChannels);
    //readPixels(pFilename, lNbChannels, lPixels);
    //writePixels("pkTest.exr", pHeight, pWidth, lPixels, lNbChannels, NO_COMPRESSION);

    if (pIsStereo)
    {
        Array2D<half> lPixelsLeft;
        lPixelsLeft.resizeErase (pHeight, pWidth * lNbChannels);
        readPixels (pFilename, lNbChannels, lPixels, lPixelsLeft);
        validatePixels (pHeight, pWidth, lPixels, lNbChannels, false);
        validatePixels (pHeight, pWidth, lPixelsLeft, lNbChannels, true);
    }
    else
    {
        readPixels (pFilename, lNbChannels, lPixels);
        validatePixels (pHeight, pWidth, lPixels, lNbChannels, false);
    }
}